

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&>
* __thiscall
testing::internal::ElementsAreArrayMatcher::operator_cast_to_Matcher
          (Matcher<const_phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&>
           *__return_storage_ptr__,ElementsAreArrayMatcher *this)

{
  ElementsAreMatcherImpl<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>const&>
  *this_00;
  undefined4 *puVar1;
  
  this_00 = (ElementsAreMatcherImpl<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>const&>
             *)operator_new(0x20);
  ElementsAreMatcherImpl<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>const&>
  ::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            (this_00,*(pair<int,_int> **)this,*(pair<int,_int> **)(this + 8));
  (__return_storage_ptr__->
  super_MatcherBase<const_phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&>
  ).vtable_ = (VTable *)
              MatcherBase<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>const&>
              ::
              GetVTable<testing::internal::MatcherBase<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>const&>::ValuePolicy<testing::MatcherInterface<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>const&>const*,true>>()
              ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(ElementsAreMatcherImpl<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>const&>
    **)(puVar1 + 2) = this_00;
  (__return_storage_ptr__->
  super_MatcherBase<const_phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&>
  ).buffer_.ptr = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0046a5a0;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    static_assert(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value,
        "use UnorderedElementsAreArray with hash tables");

    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers_.begin(), matchers_.end()));
  }